

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GreaterThanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_greaterthan(NeuralNetworkLayer *this)

{
  bool bVar1;
  GreaterThanLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_greaterthan(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_greaterthan(this);
    this_00 = (GreaterThanLayerParams *)operator_new(0x18);
    GreaterThanLayerParams::GreaterThanLayerParams(this_00);
    (this->layer_).greaterthan_ = this_00;
  }
  return (GreaterThanLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GreaterThanLayerParams* NeuralNetworkLayer::mutable_greaterthan() {
  if (!has_greaterthan()) {
    clear_layer();
    set_has_greaterthan();
    layer_.greaterthan_ = new ::CoreML::Specification::GreaterThanLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.greaterThan)
  return layer_.greaterthan_;
}